

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O2

void __thiscall
glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::deinit
          (TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize *this)

{
  TessellationShaderUtils *this_00;
  int iVar1;
  undefined4 extraout_var;
  pointer run;
  long lVar2;
  
  TestCaseBase::deinit(&this->super_TestCaseBase);
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == true) {
    iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar2 = CONCAT44(extraout_var,iVar1);
    (**(code **)(lVar2 + 0x40))(0x8c8e,0);
    (**(code **)(lVar2 + 0x48))(0x8c8e,0,0);
    (**(code **)(lVar2 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,3);
    (**(code **)(lVar2 + 0x4e8))(0x8c89);
    (**(code **)(lVar2 + 0xd8))(0);
    if (this->m_bo_id != 0) {
      (**(code **)(lVar2 + 0x438))(1,&this->m_bo_id);
      this->m_bo_id = 0;
    }
    if (this->m_vao_id != 0) {
      (**(code **)(lVar2 + 0x490))(1,&this->m_vao_id);
      this->m_vao_id = 0;
    }
    this_00 = this->m_utils_ptr;
    if (this_00 != (TessellationShaderUtils *)0x0) {
      TessellationShaderUtils::~TessellationShaderUtils(this_00);
      operator_delete(this_00,0x20);
      this->m_utils_ptr = (TessellationShaderUtils *)0x0;
    }
    for (run = (this->m_runs).
               super__Vector_base<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run,_std::allocator<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run>_>
               ._M_impl.super__Vector_impl_data._M_start;
        run != (this->m_runs).
               super__Vector_base<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run,_std::allocator<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run>_>
               ._M_impl.super__Vector_impl_data._M_finish; run = run + 1) {
      deinitTestRun(this,run);
    }
    std::
    vector<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run,_std::allocator<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run>_>
    ::clear(&this->m_runs);
    return;
  }
  return;
}

Assistant:

void TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::deinit()
{
	/** Call base class' deinit() function */
	TestCaseBase::deinit();

	if (!m_is_tessellation_shader_supported)
	{
		return;
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Revert TF buffer object bindings */
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* buffer */);
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, 0 /* buffer */);

	/* Reset GL_PATCH_VERTICES_EXT value to the default setting */
	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 3);

	/* Disable GL_RASTERIZER_DISCARD mode */
	gl.disable(GL_RASTERIZER_DISCARD);

	/* Unbind vertex array object */
	gl.bindVertexArray(0);

	/* Release all objects we might've created */
	if (m_bo_id != 0)
	{
		gl.deleteBuffers(1, &m_bo_id);

		m_bo_id = 0;
	}
	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);

		m_vao_id = 0;
	}

	if (m_utils_ptr != DE_NULL)
	{
		delete m_utils_ptr;

		m_utils_ptr = DE_NULL;
	}

	/* Release all test runs */
	for (_runs::iterator it = m_runs.begin(); it != m_runs.end(); ++it)
	{
		deinitTestRun(*it);
	}
	m_runs.clear();
}